

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateInfoSetIntegerProperty
               (HelicsFederateInfo fedInfo,int integerProperty,int propertyValue,HelicsError *err)

{
  FederateInfo *this;
  HelicsFederateInfo in_RCX;
  FederateInfo *info;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  HelicsError *in_stack_ffffffffffffffe0;
  
  this = getFedInfo(in_RCX,in_stack_ffffffffffffffe0);
  if (this != (FederateInfo *)0x0) {
    helics::CoreFederateInfo::setProperty
              (&this->super_CoreFederateInfo,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void helicsFederateInfoSetIntegerProperty(HelicsFederateInfo fedInfo, int integerProperty, int propertyValue, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    info->setProperty(integerProperty, propertyValue);
}